

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_flushsend(pingpong *pp)

{
  connectdata *pcVar1;
  curltime cVar2;
  undefined4 uStack_34;
  CURLcode result;
  curl_socket_t sock;
  ssize_t written;
  connectdata *conn;
  pingpong *pp_local;
  
  written = (ssize_t)pp->conn;
  conn = (connectdata *)pp;
  pp_local._4_4_ =
       Curl_write((connectdata *)written,((connectdata *)written)->sock[0],
                  pp->sendthis + (pp->sendsize - pp->sendleft),pp->sendleft,(ssize_t *)&result);
  if (pp_local._4_4_ == CURLE_OK) {
    if (_result == *(long *)((conn->chunk).hexbuffer + 0x10)) {
      (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + 8));
      pcVar1 = conn;
      (conn->chunk).hexbuffer[8] = '\0';
      (conn->chunk).hexbuffer[9] = '\0';
      (conn->chunk).hexbuffer[10] = '\0';
      (conn->chunk).hexbuffer[0xb] = '\0';
      (conn->chunk).hexbuffer[0xc] = '\0';
      (conn->chunk).hexbuffer[0xd] = '\0';
      (conn->chunk).hexbuffer[0xe] = '\0';
      (conn->chunk).hexbuffer[0xf] = '\0';
      *(undefined8 *)&(conn->chunk).state = 0;
      *(undefined8 *)((conn->chunk).hexbuffer + 0x10) = 0;
      cVar2 = Curl_now();
      (pcVar1->chunk).datasize = cVar2.tv_sec;
      (pcVar1->chunk).dataleft = CONCAT44(uStack_34,cVar2.tv_usec);
    }
    else {
      *(long *)((conn->chunk).hexbuffer + 0x10) =
           *(long *)((conn->chunk).hexbuffer + 0x10) - _result;
    }
    pp_local._4_4_ = CURLE_OK;
  }
  return pp_local._4_4_;
}

Assistant:

CURLcode Curl_pp_flushsend(struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  struct connectdata *conn = pp->conn;
  ssize_t written;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  CURLcode result = Curl_write(conn, sock, pp->sendthis + pp->sendsize -
                               pp->sendleft, pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    free(pp->sendthis);
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}